

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_scan_block(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  int iVar8;
  State *pSVar9;
  size_t sVar10;
  undefined8 uVar11;
  long lVar12;
  ulong offset;
  long lVar13;
  ulong uVar14;
  undefined8 unaff_RBP;
  undefined8 uVar15;
  size_t sVar16;
  char *pcVar17;
  basic_substring<const_char> *pbVar18;
  ulong uVar19;
  char *pcVar20;
  byte bVar21;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  csubstr buf;
  ro_substr chars_01;
  ro_substr chars_02;
  substr s;
  basic_substring<const_char> bVar22;
  csubstr cVar23;
  size_t indentation;
  LineContents lc;
  char msg [57];
  ulong local_1d0;
  LineContents local_1c8;
  csubstr local_188;
  char *local_178;
  undefined8 local_170;
  basic_substring<const_char> local_168;
  undefined3 local_158;
  undefined5 uStack_155;
  undefined3 uStack_150;
  undefined5 uStack_14d;
  char local_148 [40];
  undefined1 local_120;
  undefined1 local_118;
  size_t local_108;
  ulong local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar21 = 0;
  local_188 = (this->m_state->line_contents).rem;
  bVar22 = basic_substring<const_char>::triml(&local_188,' ');
  sVar16 = (long)bVar22.str - (long)local_188.str;
  if (local_188.str <= bVar22.str && sVar16 != 0) {
    _line_progressed(this,sVar16);
    local_188 = bVar22;
  }
  if ((local_188.len == 0) || ((*local_188.str != '>' && (*local_188.str != '|')))) {
    builtin_strncpy(local_148 + 0x10,"th(\'>\'))",9);
    builtin_strncpy(local_148,") || s.begins_wi",0x10);
    local_158 = 0x65622e;
    uStack_155 = 0x5f736e6967;
    uStack_150 = 0x746977;
    uStack_14d = 0x277c272868;
    local_168.str = (char *)0x6166206b63656863;
    local_168.len._0_3_ = 0x656c69;
    local_168.len._3_5_ = 0x7328203a64;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      cVar23 = (csubstr)(*pcVar1)();
      return cVar23;
    }
    uVar19 = 0;
    local_58 = 0;
    uStack_50 = 0x7ae2;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7ae2) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7ae2) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_168,0x39,LVar2,(this->m_stack).m_callbacks.m_user_data);
    if (local_188.len == 0) {
      local_1d0 = 0xffffffffffffffff;
      sVar16 = 0;
      uVar15 = 0;
      goto LAB_00226b06;
    }
  }
  uVar15 = CONCAT71((int7)((ulong)unaff_RBP >> 8),*local_188.str == '>');
  local_1d0 = 0xffffffffffffffff;
  if (local_188.len == 1) {
    uVar19 = 0;
    sVar16 = 1;
  }
  else {
    sVar16 = local_188.len;
    if ((*local_188.str != '>') && (*local_188.str != '|')) {
      local_158 = 0x65622e;
      uStack_155 = 0x5f736e6967;
      uStack_150 = 0x746977;
      uStack_14d = 0x796e615f68;
      local_168.str = (char *)0x6166206b63656863;
      local_168.len._0_3_ = 0x656c69;
      local_168.len._3_5_ = 0x7328203a64;
      builtin_strncpy(local_148,"(\"|>\"))",8);
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        cVar23 = (csubstr)(*pcVar1)();
        return cVar23;
      }
      local_80 = 0;
      uStack_78 = 0x7aed;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7aed) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x7aed) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_168,0x28,LVar3,(this->m_stack).m_callbacks.m_user_data);
      sVar16 = local_188.len;
      if (local_188.len == 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          cVar23 = (csubstr)(*pcVar1)();
          return cVar23;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
    }
    basic_substring<const_char>::basic_substring(&local_168,local_188.str + 1,sVar16 - 1);
    local_1c8.full.len = CONCAT53(local_168.len._3_5_,(undefined3)local_168.len);
    local_1c8.full.str = local_168.str;
    if (local_1c8.full.len == 0) {
      local_158 = 0x656c2e;
      uStack_155 = 0x203d3e206e;
      uStack_150 = 0x2931;
      local_168.str = (char *)0x6166206b63656863;
      local_168.len._0_3_ = 0x656c69;
      local_168.len._3_5_ = 0x7428203a64;
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        cVar23 = (csubstr)(*pcVar1)();
        return cVar23;
      }
      local_a8 = 0;
      uStack_a0 = 0x7af0;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7af0) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x7af0) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_168,0x1b,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar19 = 0;
    chars.len = 2;
    chars.str = "-+";
    sVar16 = basic_substring<const_char>::first_of(&local_1c8.full,chars,0);
    if (sVar16 != 0xffffffffffffffff) {
      if (local_1c8.full.len <= sVar16) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          cVar23 = (csubstr)(*pcVar1)();
          return cVar23;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      uVar19 = 1;
      if (*(c4 *)(local_1c8.full.str + sVar16) != (c4)0x2d) {
        uVar19 = (ulong)((uint)(*(c4 *)(local_1c8.full.str + sVar16) == (c4)0x2b) * 2);
      }
      if (sVar16 == 0) {
        if (local_1c8.full.len == 0) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar1 = (code *)swi(3);
            cVar23 = (csubstr)(*pcVar1)();
            return cVar23;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_168,(char *)(local_1c8.full.str + 1),local_1c8.full.len - 1);
      }
      else {
        if (local_1c8.full.len < sVar16) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar1 = (code *)swi(3);
            cVar23 = (csubstr)(*pcVar1)();
            return cVar23;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x154e,"num <= len || num == npos");
        }
        basic_substring<const_char>::basic_substring(&local_168,local_1c8.full.str,sVar16);
      }
      local_1c8.full.len = CONCAT53(local_168.len._3_5_,(undefined3)local_168.len);
      local_1c8.full.str = local_168.str;
    }
    uVar11 = 0;
    chars_00.len = 10;
    chars_00.str = "0123456789";
    sVar16 = basic_substring<const_char>::first_not_of(&local_1c8.full,chars_00,0);
    if ((sVar16 != 0xffffffffffffffff) && (local_1c8.full.len < sVar16)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        cVar23 = (csubstr)(*pcVar1)();
        return cVar23;
      }
      handle_error(0x2467aa,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar16 == 0xffffffffffffffff) {
      local_168.str = local_1c8.full.str;
      local_168.len._0_3_ = (undefined3)local_1c8.full.len;
      local_168.len._3_5_ = (undefined5)(local_1c8.full.len >> 0x18);
    }
    else {
      basic_substring<const_char>::basic_substring(&local_168,local_1c8.full.str,sVar16);
    }
    pcVar20 = (char *)CONCAT53(local_168.len._3_5_,(undefined3)local_168.len);
    if ((c4 *)local_168.str != (c4 *)0x0 && pcVar20 != (char *)0x0) {
      cVar23.len = (size_t)&local_1d0;
      cVar23.str = pcVar20;
      bVar7 = atou<unsigned_long>((c4 *)local_168.str,cVar23,
                                  (unsigned_long *)
                                  CONCAT71((int7)((ulong)uVar11 >> 8),
                                           (c4 *)local_168.str == (c4 *)0x0 ||
                                           pcVar20 == (char *)0x0));
      if (!bVar7) {
        bVar7 = is_debugger_attached();
        if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          cVar23 = (csubstr)(*pcVar1)();
          return cVar23;
        }
        fmt.len = 0x2a;
        fmt.str = "ERROR: parse error: could not read decimal";
        _err<>(this,fmt);
      }
      local_1d0 = local_1d0 + this->m_state->indref;
    }
    sVar16 = local_188.len;
  }
LAB_00226b06:
  _line_progressed(this,sVar16);
  _line_ended(this);
  _scan_line(this);
  pSVar9 = this->m_state;
  pcVar20 = (this->m_buf).str + (pSVar9->pos).super_LineCol.offset;
  if (pcVar20 != (pSVar9->line_contents).full.str) {
    pcVar17 = "check failed: (raw_block.begin() == m_state->line_contents.full.begin())";
    pbVar18 = &local_168;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      pbVar18->str = *(char **)pcVar17;
      pcVar17 = pcVar17 + ((ulong)bVar21 * -2 + 1) * 8;
      pbVar18 = (basic_substring<const_char> *)&pbVar18[-(ulong)bVar21].len;
    }
    local_120 = 0;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      cVar23 = (csubstr)(*pcVar1)();
      return cVar23;
    }
    local_d0 = 0;
    uStack_c8 = 0x7b12;
    local_c0 = 0;
    pcStack_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b0 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7b12) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7b12) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_168,0x49,LVar5,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  local_1c8.rem.str = (char *)0x0;
  local_1c8.rem.len = 0;
  local_1c8.stripped.str = (char *)0x0;
  local_1c8.stripped.len = 0;
  local_1c8.full.str = (char *)0x0;
  local_1c8.full.len = 0;
  local_1c8.indentation = 0;
  offset = (pSVar9->pos).super_LineCol.offset;
  uVar14 = (this->m_buf).len;
  local_100 = uVar19;
  if (offset < uVar14) {
    uVar19 = 0xffffffffffffffff;
    lVar12 = 0;
    sVar16 = 0;
    local_170 = uVar15;
    local_108 = (pSVar9->pos).super_LineCol.line;
    do {
      buf.len = uVar14;
      buf.str = (this->m_buf).str;
      LineContents::reset_with_next_line(&local_1c8,buf,offset);
      if (local_1d0 == 0xffffffffffffffff) {
        sVar10 = basic_substring<const_char>::first_not_of(&local_1c8.stripped,' ',0);
        if (sVar10 == 0xffffffffffffffff) {
          if (uVar19 == 0xffffffffffffffff) {
            uVar19 = local_1c8.indentation;
            if (local_1c8.indentation == 0xffffffffffffffff) {
              uVar19 = local_1c8.stripped.len;
            }
            if (uVar19 == 0) {
              uVar19 = (ulong)((this->m_state->flags & 0x88) != 0);
            }
          }
          else if (uVar19 < local_1c8.stripped.len) {
            uVar19 = local_1c8.stripped.len;
          }
        }
        else if (uVar19 == 0xffffffffffffffff) {
          uVar19 = this->m_state->indref;
          if (local_1c8.indentation < uVar19) {
            uVar19 = 0xffffffffffffffff;
            if (sVar16 == 0) {
              _line_ended_undo(this);
              uVar19 = 0xffffffffffffffff;
              sVar16 = 0;
              uVar15 = local_170;
              goto LAB_00226fb4;
            }
            break;
          }
          if ((local_1c8.indentation == uVar19) && ((this->m_state->flags & 0xc) != 0)) {
            uVar19 = 0xffffffffffffffff;
            break;
          }
          local_1d0 = local_1c8.indentation;
          uVar19 = 0xffffffffffffffff;
        }
        else {
          if (local_1c8.indentation < uVar19) break;
          local_1d0 = local_1c8.indentation;
        }
      }
      else {
        if (local_1c8.indentation < local_1d0) {
          chars_01.len = 4;
          chars_01.str = " \t\r\n";
          bVar22 = basic_substring<const_char>::triml(&local_1c8.rem,chars_01);
          local_168.str = bVar22.str;
          local_168.len._0_3_ = (undefined3)bVar22.len;
          local_168.len._3_5_ = bVar22.len._3_5_;
          chars_02.len = 4;
          chars_02.str = " \t\r\n";
          bVar22 = basic_substring<const_char>::trimr(&local_168,chars_02);
          if (bVar22.str != (char *)0x0 && bVar22.len != 0) break;
        }
        if (local_1d0 == 0) {
          iVar8 = basic_substring<const_char>::compare(&local_1c8.rem,"...",3);
          pcVar17 = local_1c8.rem.str;
          if (iVar8 == 0) break;
          if (local_1c8.rem.len < 4) {
            iVar8 = basic_substring<const_char>::compare(&local_1c8.rem,"---",3);
            if (iVar8 == 0) break;
          }
          else {
            lVar13 = 0;
            while (local_178 = pcVar20, local_1c8.rem.str[lVar13] == " ... "[lVar13 + 1]) {
              lVar13 = lVar13 + 1;
              if (lVar13 == 4) goto LAB_00226eae;
            }
            iVar8 = basic_substring<const_char>::compare(&local_1c8.rem,"---",3);
            pcVar20 = local_178;
            if (iVar8 == 0) break;
            lVar13 = 0;
            while (pcVar17[lVar13] == "--- "[lVar13]) {
              lVar13 = lVar13 + 1;
              if (lVar13 == 4) goto LAB_00226eae;
            }
          }
        }
      }
      pSVar9 = this->m_state;
      (pSVar9->line_contents).indentation = local_1c8.indentation;
      (pSVar9->line_contents).rem.str = local_1c8.rem.str;
      (pSVar9->line_contents).rem.len = local_1c8.rem.len;
      (pSVar9->line_contents).stripped.str = local_1c8.stripped.str;
      (pSVar9->line_contents).stripped.len = local_1c8.stripped.len;
      (pSVar9->line_contents).full.str = local_1c8.full.str;
      (pSVar9->line_contents).full.len = local_1c8.full.len;
      sVar16 = sVar16 + (this->m_state->line_contents).full.len;
      _line_progressed(this,(this->m_state->line_contents).rem.len);
      _line_ended(this);
      lVar12 = lVar12 + 1;
      offset = (this->m_state->pos).super_LineCol.offset;
      uVar14 = (this->m_buf).len;
    } while (offset < uVar14);
LAB_00226eae:
    uVar15 = local_170;
    if (((this->m_state->pos).super_LineCol.line != local_108 + lVar12) && (sVar16 != 0)) {
      pcVar17 = "check failed: (m_state->pos.line == (first + num_lines) || (raw_block.len == 0))";
      pbVar18 = &local_168;
      for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pbVar18->str = *(char **)pcVar17;
        pcVar17 = pcVar17 + ((ulong)bVar21 * -2 + 1) * 8;
        pbVar18 = (basic_substring<const_char> *)&pbVar18[-(ulong)bVar21].len;
      }
      local_118 = 0;
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        cVar23 = (csubstr)(*pcVar1)();
        return cVar23;
      }
      local_f8 = 0;
      uStack_f0 = 0x7b87;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7b87) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x7b87) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_168,0x51,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  else {
    uVar19 = 0xffffffffffffffff;
    sVar16 = 0;
    lVar12 = 0;
  }
LAB_00226fb4:
  if (local_1d0 == 0xffffffffffffffff) {
    local_1d0 = uVar19;
  }
  if (lVar12 != 0) {
    _line_ended_undo(this);
  }
  s.len = sVar16;
  s.str = pcVar20;
  cVar23 = _filter_block_scalar
                     (this,s,(BlockStyle_e)uVar15 & 0xff,(BlockChomp_e)local_100,local_1d0);
  return cVar23;
}

Assistant:

csubstr Parser::_scan_block()
{
    // nice explanation here: http://yaml-multiline.info/
    csubstr s = m_state->line_contents.rem;
    csubstr trimmed = s.triml(' ');
    if(trimmed.str > s.str)
    {
        _c4dbgp("skipping whitespace");
        _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= s.str);
        _line_progressed(static_cast<size_t>(trimmed.str - s.str));
        s = trimmed;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('|') || s.begins_with('>'));

    _c4dbgpf("scanning block: specs=\"{}\"", s);

    // parse the spec
    BlockStyle_e newline = s.begins_with('>') ? BLOCK_FOLD : BLOCK_LITERAL;
    BlockChomp_e chomp = CHOMP_CLIP; // default to clip unless + or - are used
    size_t indentation = npos; // have to find out if no spec is given
    csubstr digits;
    if(s.len > 1)
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with_any("|>"));
        csubstr t = s.sub(1);
        _c4dbgpf("scanning block: spec is multichar: '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        size_t pos = t.first_of("-+");
        _c4dbgpf("scanning block: spec chomp char at {}", pos);
        if(pos != npos)
        {
            if(t[pos] == '-')
                chomp = CHOMP_STRIP;
            else if(t[pos] == '+')
                chomp = CHOMP_KEEP;
            if(pos == 0)
                t = t.sub(1);
            else
                t = t.first(pos);
        }
        // from here to the end, only digits are considered
        digits = t.left_of(t.first_not_of("0123456789"));
        if( ! digits.empty())
        {
            if( ! c4::atou(digits, &indentation))
                _c4err("parse error: could not read decimal");
            _c4dbgpf("scanning block: indentation specified: {}. add {} from curr state -> {}", indentation, m_state->indref, indentation+m_state->indref);
            indentation += m_state->indref;
        }
    }

    // finish the current line
    _line_progressed(s.len);
    _line_ended();
    _scan_line();

    _c4dbgpf("scanning block: style={}  chomp={}  indentation={}", newline==BLOCK_FOLD ? "fold" : "literal", chomp==CHOMP_CLIP ? "clip" : (chomp==CHOMP_STRIP ? "strip" : "keep"), indentation);

    // start with a zero-length block, already pointing at the right place
    substr raw_block(m_buf.data() + m_state->pos.offset, size_t(0));// m_state->line_contents.full.sub(0, 0);
    _RYML_CB_ASSERT(m_stack.m_callbacks, raw_block.begin() == m_state->line_contents.full.begin());

    // read every full line into a raw block,
    // from which newlines are to be stripped as needed.
    //
    // If no explicit indentation was given, pick it from the first
    // non-empty line. See
    // https://yaml.org/spec/1.2.2/#8111-block-indentation-indicator
    size_t num_lines = 0, first = m_state->pos.line, provisional_indentation = npos;
    LineContents lc;
    while(( ! _finished_file()))
    {
        // peek next line, but do not advance immediately
        lc.reset_with_next_line(m_buf, m_state->pos.offset);
        _c4dbgpf("scanning block: peeking at '{}'", lc.stripped);
        // evaluate termination conditions
        if(indentation != npos)
        {
            // stop when the line is deindented and not empty
            if(lc.indentation < indentation && ( ! lc.rem.trim(" \t\r\n").empty()))
            {
                _c4dbgpf("scanning block: indentation decreased ref={} thisline={}", indentation, lc.indentation);
                break;
            }
            else if(indentation == 0)
            {
                if((lc.rem == "..." || lc.rem.begins_with("... "))
                    ||
                   (lc.rem == "---" || lc.rem.begins_with("--- ")))
                {
                    _c4dbgp("scanning block: stop. indentation=0 and stream ended");
                    break;
                }
            }
        }
        else
        {
            _c4dbgpf("scanning block: indentation ref not set. firstnonws={}", lc.stripped.first_not_of(' '));
            if(lc.stripped.first_not_of(' ') != npos) // non-empty line
            {
                _c4dbgpf("scanning block: line not empty. indref={} indprov={} indentation={}", m_state->indref, provisional_indentation, lc.indentation);
                if(provisional_indentation == npos)
                {
                    if(lc.indentation < m_state->indref)
                    {
                        _c4dbgpf("scanning block: block terminated indentation={} < indref={}", lc.indentation, m_state->indref);
                        if(raw_block.len == 0)
                        {
                            _c4dbgp("scanning block: was empty, undo next line");
                            _line_ended_undo();
                        }
                        break;
                    }
                    else if(lc.indentation == m_state->indref)
                    {
                        if(has_any(RSEQ|RMAP))
                        {
                            _c4dbgpf("scanning block: block terminated. reading container and indentation={}==indref={}", lc.indentation, m_state->indref);
                            break;
                        }
                    }
                    _c4dbgpf("scanning block: set indentation ref from this line: ref={}", lc.indentation);
                    indentation = lc.indentation;
                }
                else
                {
                    if(lc.indentation >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: set indentation ref from provisional indentation: provisional_ref={}, thisline={}", provisional_indentation, lc.indentation);
                        //indentation = provisional_indentation ? provisional_indentation : lc.indentation;
                        indentation = lc.indentation;
                    }
                    else
                    {
                        break;
                        //_c4err("parse error: first non-empty block line should have at least the original indentation");
                    }
                }
            }
            else // empty line
            {
                _c4dbgpf("scanning block: line empty or {} spaces. line_indentation={} prov_indentation={}", lc.stripped.len, lc.indentation, provisional_indentation);
                if(provisional_indentation != npos)
                {
                    if(lc.stripped.len >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.stripped.len);
                        provisional_indentation = lc.stripped.len;
                    }
                    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
                    else if(lc.indentation >= provisional_indentation && lc.indentation != npos)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.indentation);
                        provisional_indentation = lc.indentation;
                    }
                    #endif
                }
                else
                {
                    provisional_indentation = lc.indentation ? lc.indentation : has_any(RSEQ|RVAL);
                    _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    if(provisional_indentation == npos)
                    {
                        provisional_indentation = lc.stripped.len ? lc.stripped.len : has_any(RSEQ|RVAL);
                        _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    }
                }
            }
        }
        // advance now that we know the folded scalar continues
        m_state->line_contents = lc;
        _c4dbgpf("scanning block: append '{}'", m_state->line_contents.rem);
        raw_block.len += m_state->line_contents.full.len;
        _line_progressed(m_state->line_contents.rem.len);
        _line_ended();
        ++num_lines;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line == (first + num_lines) || (raw_block.len == 0));
    C4_UNUSED(num_lines);
    C4_UNUSED(first);

    if(indentation == npos)
    {
        _c4dbgpf("scanning block: set indentation from provisional: {}", provisional_indentation);
        indentation = provisional_indentation;
    }

    if(num_lines)
        _line_ended_undo();

    _c4dbgpf("scanning block: raw=~~~{}~~~", raw_block);

    // ok! now we strip the newlines and spaces according to the specs
    s = _filter_block_scalar(raw_block, newline, chomp, indentation);

    _c4dbgpf("scanning block: final=~~~{}~~~", s);

    return s;
}